

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecryptAes256ToString2_Test::~CryptoUtil_DecryptAes256ToString2_Test
          (CryptoUtil_DecryptAes256ToString2_Test *this)

{
  CryptoUtil_DecryptAes256ToString2_Test *this_local;
  
  ~CryptoUtil_DecryptAes256ToString2_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256ToString2) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea");
  std::string result = CryptoUtil::DecryptAes256ToString(key.GetBytes(), data);

  EXPECT_STREQ(result.c_str(), "test test test test");
}